

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  Char CVar1;
  code *pcVar2;
  bool bVar3;
  char cVar4;
  BOOL BVar5;
  int iVar6;
  undefined4 *puVar7;
  Type *pTVar8;
  uint uVar9;
  int iVar10;
  uint *puVar11;
  Char *pCVar12;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_00;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  Type local_8c;
  ulong uStack_88;
  int lastOcc_1;
  ulong local_80;
  undefined4 *local_78;
  int *local_70;
  int local_64;
  TextbookBoyerMoore<char16_t> *local_60;
  ulong local_58;
  int local_4c;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *pCStack_48;
  int lastOcc;
  uint *local_40;
  uint local_38;
  uint local_34;
  
  pCVar12 = input;
  local_60 = this;
  local_40 = inputOffset;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pCVar12 = (Char *)0xb9;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar3) goto LAB_00f1a605;
    *puVar7 = 0;
  }
  if (inputLength < *local_40) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    pCVar12 = (Char *)0xba;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar3) {
LAB_00f1a605:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  if (patLen <= inputLength) {
    uVar9 = *local_40;
    local_58 = (ulong)(patLen - 1);
    local_38 = inputLength - (patLen - 1);
    local_78 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if (uVar9 < local_38) {
      local_70 = (local_60->goodSuffix).ptr;
      this_00 = &local_60->lastOccurrence;
      uStack_88 = (ulong)(patLen * 4 - 4);
      local_64 = patLen - 2;
      puVar11 = local_40;
      uVar15 = (ulong)patLen;
      local_80 = (ulong)patLen;
      pCStack_48 = this_00;
      do {
        do {
          cVar4 = '\t';
          if (pat[uStack_88] != input[(int)local_58 + uVar9]) {
            local_34 = (uint)pCVar12;
            uVar13 = (uint)(ushort)input[(int)local_58 + uVar9];
            if (uVar13 < 0x100) {
              BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (this_00,uVar13);
              if (BVar5 == 0) goto LAB_00f1a49e;
              local_4c = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                   (pCStack_48,uVar13);
LAB_00f1a40f:
              if ((int)local_58 - local_4c < local_70[local_58]) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar7 = local_78;
                *local_78 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                   ,0xeb,
                                   "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                   ,
                                   "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                  );
                if (!bVar3) goto LAB_00f1a605;
                *puVar7 = 0;
              }
              uVar9 = ((int)local_58 - local_4c) + uVar9;
              bVar3 = uVar9 < local_38;
              cVar4 = !bVar3;
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (this_00,uVar13,&local_4c);
              if (bVar3) goto LAB_00f1a40f;
LAB_00f1a49e:
              uVar9 = uVar9 + (int)uVar15;
              bVar3 = uVar9 < local_38;
              cVar4 = '\x01';
              if (bVar3) {
                cVar4 = '\b';
              }
            }
            pCVar12 = (Char *)(ulong)CONCAT31((int3)(local_34 >> 8),(byte)local_34 & bVar3);
            puVar11 = local_40;
            this_00 = pCStack_48;
          }
        } while ((cVar4 == '\0') || (cVar4 == '\b'));
        if (cVar4 != '\t') goto LAB_00f1a5e9;
        iVar14 = local_64;
        if (local_58 == 0) {
          *puVar11 = uVar9;
          pCVar12 = (Char *)&DAT_00000001;
          goto LAB_00f1a5e9;
        }
        do {
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          CVar1 = input[uVar9 + iVar14];
          uVar13 = iVar14 * 4;
          if ((((pat[uVar13] == CVar1) || (pat[(ulong)uVar13 + 1] == CVar1)) ||
              (pat[(ulong)uVar13 + 2] == CVar1)) || (pat[(ulong)uVar13 + 3] == CVar1)) {
            iVar14 = iVar14 + -1;
            if (iVar14 < 0) {
              *puVar11 = uVar9;
              pCVar12 = (Char *)CONCAT71((int7)((ulong)pCVar12 >> 8),1);
              iVar6 = 1;
              bVar3 = false;
            }
            else {
              iVar6 = 0;
              bVar3 = true;
            }
          }
          else {
            local_34 = (uint)pCVar12;
            uVar13 = (uint)(ushort)CVar1;
            if (uVar13 < 0x100) {
              BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (this_00,uVar13);
              if (BVar5 == 0) {
                iVar6 = (local_60->lastOccurrence).defv;
              }
              else {
                iVar6 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                  (pCStack_48,uVar13);
              }
            }
            else {
              bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (this_00,uVar13,&local_8c);
              pTVar8 = &(local_60->lastOccurrence).defv;
              if (bVar3) {
                pTVar8 = &local_8c;
              }
              iVar6 = *pTVar8;
            }
            pCVar12 = (Char *)(ulong)local_34;
            iVar10 = iVar14 - iVar6;
            if (iVar14 - iVar6 <= local_70[iVar14]) {
              iVar10 = local_70[iVar14];
            }
            uVar9 = iVar10 + uVar9;
            iVar6 = 0xd;
            bVar3 = false;
            puVar11 = local_40;
            this_00 = pCStack_48;
          }
        } while (iVar6 == 0);
        if ((iVar6 != 0xd) && (!bVar3)) goto LAB_00f1a5e9;
        uVar15 = local_80;
      } while (uVar9 < local_38);
    }
  }
  pCVar12 = (Char *)0x0;
LAB_00f1a5e9:
  return (bool)((byte)pCVar12 & 1);
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }